

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void absl::lts_20240722::log_internal::SetTimeZone(TimeZone *param_1)

{
  bool bVar1;
  __pointer_type __p2;
  char *absl_raw_log_internal_basename;
  TimeZone *new_tz;
  TimeZone *expected;
  TimeZone tz_local;
  
  new_tz = (TimeZone *)0x0;
  expected = param_1;
  __p2 = (__pointer_type)operator_new(8);
  *(TimeZone **)__p2 = expected;
  bVar1 = std::atomic<absl::lts_20240722::TimeZone_*>::compare_exchange_strong
                    ((atomic<absl::lts_20240722::TimeZone_*> *)&(anonymous_namespace)::timezone_ptr,
                     &new_tz,__p2,memory_order_release,memory_order_relaxed);
  if (!bVar1) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"globals.cc",0x69,"absl::log_internal::SetTimeZone() has already been called")
    ;
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/log/internal/globals.cc"
                  ,0x69,"void absl::log_internal::SetTimeZone(absl::TimeZone)");
  }
  return;
}

Assistant:

void SetTimeZone(absl::TimeZone tz) {
  absl::TimeZone* expected = nullptr;
  absl::TimeZone* new_tz = new absl::TimeZone(tz);
  // timezone_ptr can only be set once, otherwise new_tz is leaked.
  if (!timezone_ptr.compare_exchange_strong(expected, new_tz,
                                            std::memory_order_release,
                                            std::memory_order_relaxed)) {
    ABSL_RAW_LOG(FATAL,
                 "absl::log_internal::SetTimeZone() has already been called");
  }
}